

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O2

void __thiscall
Hpipe::CppEmitter::write_label(CppEmitter *this,StreamSepMaker *ss,uint num,char letter)

{
  bool bVar1;
  StreamSep *pSVar2;
  char letter_local;
  uint num_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  StreamSep local_f0;
  StreamSepMaker local_a8;
  
  letter_local = letter;
  num_local = num;
  StreamSepMaker::rm_beg(&local_a8,ss,2);
  StreamSepMaker::operator<<(&local_f0,&local_a8,&letter_local);
  pSVar2 = StreamSep::operator<<(&local_f0,(char (*) [2])0x1799f6);
  pSVar2 = StreamSep::operator<<(pSVar2,&num_local);
  pSVar2 = StreamSep::operator<<(pSVar2,(char (*) [2])0x1776d7);
  bVar1 = this->trace_labels;
  if (bVar1 == true) {
    to_string<char>(&local_150,&letter_local);
    std::operator+(&local_130," std::cout << \"",&local_150);
    std::operator+(&local_110,&local_130,"_");
    to_string<unsigned_int>(&local_170,&num_local);
    std::operator+(&local_1b0,&local_110,&local_170);
    std::operator+(&local_190,&local_1b0,"\\t\" << __LINE__ << std::endl;");
  }
  else {
    std::__cxx11::string::string((string *)&local_190,"",(allocator *)&local_1b0);
  }
  StreamSep::operator<<(pSVar2,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  if (bVar1 != false) {
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
  }
  StreamSep::~StreamSep(&local_f0);
  StreamSepMaker::~StreamSepMaker(&local_a8);
  return;
}

Assistant:

void CppEmitter::write_label( StreamSepMaker &ss, unsigned num, char letter ) {
    ss.rm_beg( 2 ) << letter << "_" << num << ":" << ( trace_labels ? " std::cout << \"" + to_string( letter ) + "_" + to_string( num ) + "\\t\" << __LINE__ << std::endl;" : "" );
}